

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

double __thiscall
ON_NurbsSurface::GetCubicBezierApproximation
          (ON_NurbsSurface *this,double max_deviation,ON_3dPoint (*bezCV) [4])

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  double s;
  double dVar4;
  double t;
  bool bVar5;
  double max_deviation_00;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  ON_3dPoint *pOVar9;
  uint uVar10;
  bool bVar11;
  int side;
  ulong uVar12;
  ON_3dPoint *pOVar13;
  int j;
  long lVar14;
  int i;
  long lVar15;
  ON_3dPoint *g;
  int hint [2];
  ON_3dPoint nurbsP;
  ON_3dPoint bezP;
  ON_2dex cvdex [4];
  double c [4];
  ON_3dPoint srfP [4];
  ON_3dPoint Q [4];
  double g_buffer [64];
  double local_478;
  double local_460;
  double local_458;
  long local_450;
  undefined8 local_430;
  ON_3dPoint local_428;
  ON_3dVector local_408;
  double local_3f0;
  ON_3dPoint local_3e8;
  ON_2dex local_3d0;
  ON_Interval local_3c8;
  ON_Interval local_3b8;
  double local_3a8 [4];
  ON_BezierSurface local_388;
  ON_3dPoint local_360;
  ON_3dPoint local_348;
  double local_330;
  double dStack_328;
  double local_320;
  double local_318;
  double dStack_310;
  double local_308;
  double local_300;
  double dStack_2f8;
  double local_2f0;
  ON_3dPoint local_2e8;
  ON_3dPoint local_2d0;
  ON_3dPoint local_2b8;
  ON_3dPoint local_2a0;
  ON_3dPoint local_280;
  ON_3dPoint local_268;
  ON_3dPoint local_250;
  ON_3dPoint local_238 [21];
  ON_NurbsCurve *this_00;
  
  max_deviation_00 = ON_DBL_QNAN;
  local_458 = ON_DBL_QNAN;
  local_3f0 = max_deviation;
  bVar6 = ON_Object::ThisIsNullptr((ON_Object *)this,false);
  if ((((!bVar6) && (1 < this->m_order[0])) && (1 < this->m_order[1])) &&
     ((this->m_cv_count[0] < 0x41 && this->m_order[0] <= this->m_cv_count[0] &&
      (this->m_cv_count[1] < 0x41 && this->m_order[1] <= this->m_cv_count[1])))) {
    uVar12 = 0;
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    local_3a8[0] = ON_Interval::operator[](&local_3b8,0);
    local_3a8[1] = ON_Interval::operator[](&local_3c8,1);
    local_3a8[2] = ON_Interval::operator[](&local_3b8,1);
    local_3a8[3] = ON_Interval::operator[](&local_3c8,0);
    dVar3 = 0.0;
    do {
      iVar7 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                        (SUB84(local_3a8[uVar12],0),this,(ulong)((uint)uVar12 & 1));
      this_00 = (ON_NurbsCurve *)CONCAT44(extraout_var,iVar7);
      if (this_00 == (ON_NurbsCurve *)0x0) {
        return max_deviation_00;
      }
      bVar6 = ON_Object::IsKindOf((ON_Object *)this_00,&ON_NurbsCurve::m_ON_NurbsCurve_class_rtti);
      local_460 = max_deviation_00;
      if (bVar6) {
        pOVar13 = *bezCV;
        if (uVar12 == 1) {
          pOVar13 = bezCV[3];
        }
        if ((uVar12 & 1) == 0) {
          pOVar13 = &local_2e8;
        }
        local_460 = ON_NurbsCurve::GetCubicBezierApproximation(this_00,max_deviation_00,pOVar13);
      }
      if (local_460 < 0.0) {
        return max_deviation_00;
      }
      if ((uVar12 & 1) == 0) {
        lVar8 = 0x48;
        if (uVar12 == 0) {
          lVar8 = 0;
        }
        *(double *)((long)&bezCV[1][0].z + lVar8) = local_2d0.z;
        pdVar2 = (double *)((long)&bezCV[1][0].x + lVar8);
        *pdVar2 = local_2d0.x;
        pdVar2[1] = local_2d0.y;
        *(double *)((long)&bezCV[2][0].z + lVar8) = local_2b8.z;
        pdVar2 = (double *)((long)&bezCV[2][0].x + lVar8);
        *pdVar2 = local_2b8.x;
        pdVar2[1] = local_2b8.y;
      }
      if (local_460 <= dVar3) {
        local_460 = dVar3;
      }
      (*(this_00->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])(this_00);
      uVar12 = uVar12 + 1;
      dVar3 = local_460;
    } while (uVar12 != 4);
    bezCV[1][1].z = ON_3dPoint::Origin.z;
    dVar3 = ON_3dPoint::Origin.y;
    bezCV[1][1].x = ON_3dPoint::Origin.x;
    bezCV[1][1].y = dVar3;
    bezCV[1][2].z = ON_3dPoint::Origin.z;
    dVar3 = ON_3dPoint::Origin.y;
    bezCV[1][2].x = ON_3dPoint::Origin.x;
    bezCV[1][2].y = dVar3;
    dVar3 = ON_3dPoint::Origin.y;
    bezCV[2][1].x = ON_3dPoint::Origin.x;
    bezCV[2][1].y = dVar3;
    bezCV[2][1].z = ON_3dPoint::Origin.z;
    dVar3 = ON_3dPoint::Origin.y;
    bezCV[2][2].x = ON_3dPoint::Origin.x;
    bezCV[2][2].y = dVar3;
    bezCV[2][2].z = ON_3dPoint::Origin.z;
    ON_BezierSurface::ON_BezierSurface(&local_388);
    local_388.m_dim = 3;
    local_388.m_is_rat = 0;
    local_388.m_order[0] = 4;
    local_388.m_order[1] = 4;
    local_388.m_cv_stride[0] = 0xc;
    local_388.m_cv_stride[1] = 3;
    local_348.z = ON_3dPoint::Origin.z;
    local_348.x = ON_3dPoint::Origin.x;
    local_348.y = ON_3dPoint::Origin.y;
    local_330 = ON_3dPoint::Origin.x;
    dStack_328 = ON_3dPoint::Origin.y;
    local_320 = ON_3dPoint::Origin.z;
    local_318 = ON_3dPoint::Origin.x;
    dStack_310 = ON_3dPoint::Origin.y;
    local_308 = ON_3dPoint::Origin.z;
    local_300 = ON_3dPoint::Origin.x;
    dStack_2f8 = ON_3dPoint::Origin.y;
    local_2f0 = ON_3dPoint::Origin.z;
    local_430 = 0;
    lVar8 = 0;
    local_388.m_cv = (double *)bezCV;
    do {
      dVar3 = ON_Interval::ParameterAt(&local_3c8,(double)(&DAT_006c7140)[lVar8 * 2]);
      ON_Interval::ParameterAt(&local_3b8,(double)(&DAT_006c7148)[lVar8 * 2]);
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37])
                (SUB84(dVar3,0),this,0,3,&local_348 + lVar8,0,&local_430);
      ON_3dPoint::ON_3dPoint(local_238,0.0,0.0,0.0);
      ON_3dPoint::ON_3dPoint(&local_3e8,0.0,0.0,0.0);
      lVar15 = 0;
      pOVar13 = *bezCV;
      do {
        lVar14 = 0;
        pOVar9 = pOVar13;
        do {
          if (1 < ((int)lVar14 - 1U | (int)lVar15 - 1U)) {
            ::operator*(&local_428,
                        *(double *)
                         ((long)&DAT_006c7100 + lVar15 * 8 + (ulong)(((uint)lVar8 & 1) << 5)) *
                        *(double *)
                         ((long)&DAT_006c7100 + (lVar8 * 0x10 & 0xffffffffffffffe0U) + lVar14 * 8),
                        pOVar9);
            ON_3dVector::ON_3dVector(&local_408,&local_428);
            ON_3dPoint::operator+=(local_238,&local_408);
          }
          lVar14 = lVar14 + 1;
          pOVar9 = pOVar9 + 1;
        } while (lVar14 != 4);
        lVar15 = lVar15 + 1;
        pOVar13 = pOVar13 + 4;
      } while (lVar15 != 4);
      ::operator*(&local_428,2.25,&local_348 + lVar8);
      ON_3dPoint::operator/(&local_360,local_238,324.0);
      ON_3dPoint::operator-(&local_408,&local_428,&local_360);
      ON_3dPoint::operator=(&local_2e8 + lVar8,&local_408);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    ON_2dex::ON_2dex((ON_2dex *)&local_3e8,1,1);
    ON_2dex::ON_2dex((ON_2dex *)&local_3e8.y,2,1);
    ON_2dex::ON_2dex((ON_2dex *)&local_3e8.z,1,2);
    ON_2dex::ON_2dex(&local_3d0,2,2);
    lVar8 = 0;
    do {
      ::operator*(&local_360,*(double *)((long)&DAT_006c7180 + lVar8 * 4),&local_2e8);
      ::operator*(&local_250,*(double *)((long)&DAT_006c7188 + lVar8 * 4),&local_2d0);
      ON_3dPoint::operator+(&local_428,&local_360,&local_250);
      ::operator*(&local_268,*(double *)((long)&DAT_006c7190 + lVar8 * 4),&local_2b8);
      ON_3dPoint::operator+((ON_3dPoint *)&local_408,&local_428,&local_268);
      ::operator*(&local_280,*(double *)((long)&DAT_006c7198 + lVar8 * 4),&local_2a0);
      ON_3dPoint::operator+(local_238,(ON_3dPoint *)&local_408,&local_280);
      iVar7 = *(int *)((long)&local_3e8.x + lVar8);
      iVar1 = *(int *)((long)&local_3e8.x + lVar8 + 4);
      bezCV[iVar7][iVar1].z = local_238[0].z;
      bezCV[iVar7][iVar1].x = local_238[0].x;
      bezCV[iVar7][iVar1].y = local_238[0].y;
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    local_478 = 0.0;
    pOVar13 = &local_348;
    lVar8 = 0;
    pOVar9 = local_238;
    do {
      ON_3dPoint::ON_3dPoint(pOVar9,0.0,0.0,0.0);
      ON_BezierSurface::Evaluate
                (&local_388,*(double *)((long)&DAT_006c7140 + lVar8),
                 *(double *)((long)&DAT_006c7148 + lVar8),0,3,&pOVar9->x);
      dVar3 = ON_3dPoint::DistanceTo(pOVar13,pOVar9);
      local_478 = local_478 + dVar3;
      pOVar13 = pOVar13 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    iVar7 = this->m_cv_count[0];
    uVar10 = this->m_cv_count[1] + iVar7;
    if (0x20 < (int)uVar10) {
      pOVar9 = (ON_3dPoint *)onmalloc((ulong)uVar10 << 3);
      iVar7 = this->m_cv_count[0];
    }
    pOVar13 = (ON_3dPoint *)(&pOVar9->x + iVar7);
    lVar8 = 0;
    g = pOVar9;
    bVar6 = true;
    do {
      bVar11 = bVar6;
      GetGrevilleAbcissae(this,(int)lVar8,&g->x);
      if (this->m_order[lVar8] == 4) {
        pdVar2 = this->m_knot[lVar8];
        dVar3 = pdVar2[2];
        if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
          g->x = dVar3;
          g->y = (pdVar2[2] + pdVar2[2] + pdVar2[3]) / 3.0;
        }
        lVar8 = (long)this->m_cv_count[lVar8];
        if (pdVar2[lVar8 + -1] < pdVar2[lVar8 + 1]) {
          *(double *)((long)g + lVar8 * 8 + -8) = pdVar2[lVar8 + -1];
          *(double *)((long)g + lVar8 * 8 + -0x10) =
               (pdVar2[lVar8 + -1] + pdVar2[lVar8 + -1] + pdVar2[lVar8 + -2]) / 3.0;
        }
      }
      lVar8 = 1;
      g = pOVar13;
      bVar6 = false;
    } while (bVar11);
    local_408.z = ON_3dPoint::Origin.z;
    local_408.x = ON_3dPoint::Origin.x;
    local_408.y = ON_3dPoint::Origin.y;
    local_428.z = ON_3dPoint::Origin.z;
    local_428.x = ON_3dPoint::Origin.x;
    local_428.y = ON_3dPoint::Origin.y;
    local_430 = 0;
    if (1 < this->m_cv_count[0]) {
      local_450 = 1;
      do {
        bVar6 = true;
        do {
          bVar11 = bVar6;
          if (bVar11) {
            dVar3 = (*(double *)((long)pOVar9 + local_450 * 8 + -8) + (&pOVar9->x)[local_450]) * 0.5
            ;
          }
          else {
            dVar3 = (&pOVar9->x)[local_450];
          }
          s = ON_Interval::NormalizedParameterAt(&local_3c8,dVar3);
          if (((0.0 < s) && (s < 1.0)) && (1 < this->m_cv_count[1])) {
            lVar8 = 1;
            do {
              bVar6 = true;
              do {
                bVar5 = bVar6;
                if (bVar5) {
                  dVar4 = (*(double *)((long)pOVar13 + lVar8 * 8 + -8) + (&pOVar13->x)[lVar8]) * 0.5
                  ;
                }
                else {
                  dVar4 = (&pOVar13->x)[lVar8];
                }
                t = ON_Interval::NormalizedParameterAt(&local_3b8,dVar4);
                if ((0.0 < t) && (t < 1.0)) {
                  ON_BezierSurface::Evaluate(&local_388,s,t,0,3,(double *)&local_408);
                  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x37]
                  )(SUB84(dVar3,0),dVar4,this,0,3,&local_428,0,&local_430);
                  dVar4 = ON_3dPoint::DistanceTo(&local_428,(ON_3dPoint *)&local_408);
                  if ((local_478 * 16.0 < dVar4) &&
                     (((local_460 < dVar4 && (local_460 = dVar4, 0.0 <= local_3f0)) &&
                      (local_3f0 < dVar4)))) {
                    local_460 = max_deviation_00;
                    goto LAB_00540668;
                  }
                }
                bVar6 = false;
              } while (bVar5);
              lVar8 = lVar8 + 1;
            } while (lVar8 < this->m_cv_count[1]);
          }
          bVar6 = false;
        } while (bVar11);
        local_450 = local_450 + 1;
      } while (local_450 < this->m_cv_count[0]);
    }
LAB_00540668:
    ON_BezierSurface::~ON_BezierSurface(&local_388);
    local_458 = local_460;
  }
  return local_458;
}

Assistant:

double ON_NurbsSurface::GetCubicBezierApproximation(
  double max_deviation,
  ON_3dPoint bezCV[4][4]
) const
{
  const double failed_rc = ON_DBL_QNAN;

  if ( ThisIsNullptr(false) )
    return failed_rc;
  if (this->m_order[0] < 2 || this->m_order[1] < 2)
    return failed_rc;
  if (this->m_cv_count[0] < this->m_order[0] || this->m_cv_count[0] > 64)
    return failed_rc;
  if (this->m_cv_count[1] < this->m_order[1] || this->m_cv_count[1] > 64)
    return failed_rc;

  ON_3dPoint Q[4];
  
  const ON_Interval domain[2] = { this->Domain(0),this->Domain(1) };
  
  const double c[4] = { domain[1][0],domain[0][1],domain[1][1],domain[0][0] };
  const double maximum_deviation = ON_DBL_QNAN;
  double deviation = 0.0;
  for (int side = 0; side < 4; side++)
  {
    ON_Curve* iso = this->IsoCurve((side%2), c[side]);
    if (nullptr == iso)
      return failed_rc;
    const ON_NurbsCurve* nurbs_curve = ON_NurbsCurve::Cast(iso);
    double d
      = (nullptr != nurbs_curve)
      ? nurbs_curve->GetCubicBezierApproximation(
        maximum_deviation,
        (0 == (side % 2)) ? Q : &bezCV[(1 == side) ? 3 : 0][0])
      : ON_DBL_QNAN;
    if (false == (d >= 0.0))
      return failed_rc;
    if (d > deviation)
      deviation = d;
    if (0 == (side % 2))
    {
      int j = (0 == side) ? 0 : 3;
      bezCV[1][j] = Q[1];
      bezCV[2][j] = Q[2];
    }
    delete iso;
  }

  bezCV[1][1] = ON_3dPoint::Origin;
  bezCV[1][2] = ON_3dPoint::Origin;
  bezCV[2][1] = ON_3dPoint::Origin;
  bezCV[2][2] = ON_3dPoint::Origin;

  ON_BezierSurface bezS;
  bezS.m_dim = 3;
  bezS.m_is_rat = 0;
  bezS.m_order[0] = 4;
  bezS.m_order[1] = 4;
  bezS.m_cv_stride[0] = (int)(&bezCV[1][0].x - &bezCV[0][0].x);
  bezS.m_cv_stride[1] = (int)(&bezCV[0][1].x - &bezCV[0][0].x);
  bezS.m_cv = &bezCV[0][0].x;


  // b[0][] = 27*(bernstein cubics at 1/3)
  // b[1][] = 27*(bernstein cubics at 2/3)
  const double b[2][4] = {
    { 8.0, 12.0, 6.0, 1.0 },
    { 1.0, 6.0, 12.0, 8.0 } 
  };

  // uv[4] = {{1/3,1/3}, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // K[n] = (27*27)*bezCV(uv[n])
  // P[n] = this(domain.ParameterAt(uv[n]));
  // 36* M * Transpose[C11,C21,C12,C22] = [X0,X1,X2,X3]
  // uv[4] = {{1/3,1/3{, {2/3,1/3}, {1/3,2/3}, {2/3,2/3} }
  // X0 = nurbs_srf(1/3,1/3) - K[0]/(27*27)
  // A[4][4] = 4x4 matrix with rows
  // 36*A[0][] = {b1[1]*b1[1], b1[2]*b1[1], b1[1]*b1[2], b1[2]*b1[2] }
  // 36*A[1][] = {b2[1]*b1[1], b2[2]*b1[1], b2[1]*b1[2], b2[2]*b1[2] }
  // 36*A[2][] = {b1[1]*b2[1], b1[2]*b2[1], b1[1]*b2[2], b1[2]*b2[2] }
  // 36*A[3][] = {b2[1]*b2[1], b2[2]*b2[1], b2[1]*b2[2], b2[2]*b2[2] }
  // K[n] + 36*(A[n][0]*C11 + A[n][1]*C21 + A[n][2]*C12 + A[n][3]*C22) = (27*27)P[n]
  // A*Transpose(C11,C21,C12,C22) = Transpose(X[0],X[1],X[2],X[3])
  // X[n] = ((27*27)P[n] - K[n])/36 = 81/4*P[n] - K[n]/36.0
  // Inverse(A) = M/9.
  // Transpose(C11,C21,C12,C22) = M*Transpose(X[0],X[1],X[2],X[3])/9
  // Q[n] = X[n]/9 = 2.25*P[n] - K[n]/324.0
  // bezCV[cvdex[n].i][cvdex[n].i] = M*Transpose(X[0],X[1],X[2],X[3])/9
  const double bezuv[4][2] =
  {
    {(1.0 / 3.0), (1.0 / 3.0)},
    {(2.0 / 3.0), (1.0 / 3.0)},
    {(1.0 / 3.0), (2.0 / 3.0)},
    {(2.0 / 3.0), (2.0 / 3.0)}
  };
  ON_3dPoint srfP[4] = { ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin,ON_3dPoint::Origin };
  int hint[2] = {};
  for (int n = 0; n < 4; n++)
  {
    this->Evaluate(domain[0].ParameterAt(bezuv[n][0]),domain[1].ParameterAt(bezuv[n][1]), 0, 3, &srfP[n].x, 0, hint);
    const double* bi = b[n%2];
    const double* bj = b[n/2];
    ON_3dPoint K(0.0, 0.0, 0.0);
    ON_3dPoint valQ(0, 0, 0);
    for (int i = 0; i < 4; i++) for (int j = 0; j < 4; j++)
    {
      if ((1 == i || 2 == i) && (1 == j || 2 == j))
        continue;
      K += (bi[i] * bj[j])*bezCV[i][j];
    }
    Q[n] = (2.25*srfP[n]) - (K/324.0);
  }

  const ON_2dex cvdex[4]{ON_2dex(1,1),ON_2dex(2,1),ON_2dex(1,2),ON_2dex(2,2)};

  ////const double A[4][4] =
  ////{
  ////  {4.0, 2.0, 2.0, 1.0},
  ////  {2.0, 4.0, 1.0, 2.0},
  ////  {2.0, 1.0, 4.0, 2.0},
  ////  {1.0, 2.0, 2.0, 4.0}
  ////};

  const double M[4][4] =
  {
    {4.0,-2.0,-2.0,1.0},
    {-2.0,4.0,1.0,-2.0},
    {-2.0,1.0,4.0,-2.0},
    {1.0,-2.0,-2.0,4.0}
  };

  for (int n = 0; n < 4; n++)
    bezCV[cvdex[n].i][cvdex[n].j] = M[n][0] * Q[0] + M[n][1] * Q[1] + M[n][2] * Q[2] + M[n][3] * Q[3];

  double zero_tol = 0.0;
  for (int n = 0; n < 4; n++)
  {
    ON_3dPoint bezP(0.0, 0.0, 0.0);
    bezS.Evaluate(bezuv[n][0], bezuv[n][1], 0, 3, &bezP.x);
    double d = srfP[n].DistanceTo(bezP);
    zero_tol += d;
  }
  zero_tol = 16.0*zero_tol;

  double g_buffer[64];
  double* g[2];
  g[0] 
    = (m_cv_count[0] + m_cv_count[1] <= 32)
    ? g_buffer 
    : (double*)onmalloc((m_cv_count[0] + m_cv_count[1]) * sizeof(g[0][0]));
  g[1] = g[0] + m_cv_count[0];
  for (int dir = 0; dir < 2; dir++)
  {
    this->GetGrevilleAbcissae(dir, g[dir]);
    if (4 == this->m_order[dir])
    {
      const double* k = this->m_knot[dir];
      if (k[0] < k[2])
      {
        g[dir][0] = k[2];
        g[dir][1] = (2.0*k[2] + k[3]) / 3.0;
      }
      const int cv_count = this->m_cv_count[dir];
      k += (cv_count - this->m_order[dir]);
      if (k[3] < k[5])
      {
        g[dir][cv_count-1] = k[3];
        g[dir][cv_count-2] = (2.0*k[3] + k[2]) / 3.0;
      }
    }
  }

  ON_3dPoint bezP(ON_3dPoint::Origin), nurbsP(ON_3dPoint::Origin);
  hint[0] = 0;
  hint[1] = 0;
  for (int i = 1; i < this->m_cv_count[0]; i++)
  {
    for (int passi = 0; passi < 2; passi++)
    {
      const double t0 = (0 == passi) ? 0.5*(g[0][i - 1] + g[0][i]) : g[0][i];
      const double s0 = domain[0].NormalizedParameterAt(t0);
      if (false == (s0 > 0.0 && s0 < 1.0))
        continue;
      for (int j = 1; j < this->m_cv_count[1]; j++)
      {
        for (int passj = 0; passj < 2; passj++)
        {
          const double t1 = (0 == passj) ? 0.5*(g[1][j - 1] + g[1][j]) : g[1][j];
          const double s1 = domain[1].NormalizedParameterAt(t1);
          if (false == (s1 > 0.0 && s1 < 1.0))
            continue;
          bezS.Evaluate(s0,s1, 0, 3, &bezP.x);
          this->Evaluate(t0,t1, 0, 3, &nurbsP.x, 0, hint);
          double d = nurbsP.DistanceTo(bezP);
          if (d > zero_tol && d > deviation)
          {
            deviation = d;
            if (max_deviation >= 0.0 && deviation > max_deviation)
              return failed_rc;
          }
        }
      }
    }
  }

  return deviation;
}